

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_functions.h
# Opt level: O2

void TestGMAA(Arguments *args)

{
  byte bVar1;
  BGIP_SolverCreatorInterface *pBVar2;
  ostream *poVar3;
  time_t tVar4;
  PlanningUnitMADPDiscreteParameters params;
  QMDP qmdp;
  QBG qbg;
  QPOMDP qpomdp;
  GMAA_kGMAA gmaa_em;
  double local_bd8;
  ProblemDecTiger pdt;
  GMAA_MAAstarClassic gmaa_maa3;
  double local_540;
  GMAA_MAAstarClassic gmaa_maa;
  double local_100;
  
  ProblemDecTiger::ProblemDecTiger(&pdt);
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(&params);
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&params,0));
  pBVar2 = (BGIP_SolverCreatorInterface *)operator_new(0x28);
  pBVar2->_vptr_BGIP_SolverCreatorInterface =
       (_func_int **)&PTR__BGIP_SolverCreatorInterface_00122ac8;
  pBVar2[1]._vptr_BGIP_SolverCreatorInterface = (_func_int **)0xa;
  *(undefined4 *)&pBVar2[2]._vptr_BGIP_SolverCreatorInterface = 0;
  pBVar2[3]._vptr_BGIP_SolverCreatorInterface = (_func_int **)0x1;
  pBVar2[4]._vptr_BGIP_SolverCreatorInterface = (_func_int **)0x0;
  GMAA_kGMAA::GMAA_kGMAA
            (&gmaa_em,pBVar2,2,
             (DecPOMDPDiscreteInterface *)
             (&pdt.super_DecPOMDPDiscrete + *(long *)(pdt._0_8_ + -0x50)),&params,1);
  QMDP::QMDP(&qmdp,(PlanningUnitDecPOMDPDiscrete *)&gmaa_em,false);
  QMDP::Compute();
  poVar3 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"-gmaa_em.Print()---------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  PlanningUnitMADPDiscrete::Print();
  poVar3 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"-gmaa_em.Plan()- QMDP - horizon=2------");
  std::endl<char,std::char_traits<char>>(poVar3);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  GeneralizedMAAStarPlanner::Plan();
  if (args->testMode == false) {
    std::operator<<((ostream *)&std::cout,"\napprox. value=");
    poVar3 = std::ostream::_M_insert<double>(local_bd8);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  QPOMDP::QPOMDP(&qpomdp,(PlanningUnitDecPOMDPDiscrete *)&gmaa_em);
  QFunctionJAOHTree::Compute();
  poVar3 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"-gmaa_em.Plan()- QPOMDP - horizon=2----");
  std::endl<char,std::char_traits<char>>(poVar3);
  GeneralizedMAAStarPlanner::Plan();
  if (args->testMode == false) {
    std::operator<<((ostream *)&std::cout,"\napprox. value=");
    poVar3 = std::ostream::_M_insert<double>(local_bd8);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  QBG::QBG(&qbg,(PlanningUnitDecPOMDPDiscrete *)&gmaa_em);
  QFunctionJAOHTree::Compute();
  poVar3 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"-gmaa_em.Plan()- QBG - horizon=2----");
  std::endl<char,std::char_traits<char>>(poVar3);
  GeneralizedMAAStarPlanner::Plan();
  bVar1 = args->testMode;
  if ((bool)bVar1 == false) {
    std::operator<<((ostream *)&std::cout,"\napprox. value=");
    poVar3 = std::ostream::_M_insert<double>(local_bd8);
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar1 = args->testMode;
  }
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"press <enter> to continue...");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::istream::get();
  }
  GMAA_MAAstarClassic::GMAA_MAAstarClassic
            (&gmaa_maa,2,
             (DecPOMDPDiscreteInterface *)
             (&pdt.super_DecPOMDPDiscrete + *(long *)(pdt._0_8_ + -0x50)),&params,0);
  QMDP::SetPU((PlanningUnitDecPOMDPDiscrete *)&qmdp);
  QMDP::Compute();
  poVar3 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"-gmaa_maa.Print()---------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  PlanningUnitMADPDiscrete::Print();
  poVar3 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "-gmaa_maa.Plan()- QMDP - horizon=2----------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  bVar1 = args->testMode;
  if ((bool)bVar1 == false) {
    std::operator<<((ostream *)&std::cout,"\nexact. value=");
    poVar3 = std::ostream::_M_insert<double>(local_100);
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar1 = args->testMode;
  }
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"press <enter> to continue...");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::istream::get();
  }
  GMAA_MAAstarClassic::GMAA_MAAstarClassic
            (&gmaa_maa3,3,
             (DecPOMDPDiscreteInterface *)
             (&pdt.super_DecPOMDPDiscrete + *(long *)(pdt._0_8_ + -0x50)),&params,0);
  QFunctionJAOHTree::SetPU((PlanningUnitDecPOMDPDiscrete *)&qbg);
  QFunctionJAOHTree::Compute();
  poVar3 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"-gmaa_maa3.Print()---------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  PlanningUnitMADPDiscrete::Print();
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "-gmaa_maa.Plan()- QMDP - horizon=3----------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  GeneralizedMAAStarPlanner::Plan();
  if (args->testMode == false) {
    std::operator<<((ostream *)&std::cout,"\nexact. value=");
    poVar3 = std::ostream::_M_insert<double>(local_540);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::~GeneralizedMAAStarPlannerForDecPOMDPDiscrete
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)&gmaa_maa3);
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::~GeneralizedMAAStarPlannerForDecPOMDPDiscrete
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)&gmaa_maa);
  QBG::~QBG(&qbg);
  QPOMDP::~QPOMDP(&qpomdp);
  QMDP::~QMDP(&qmdp);
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::~GeneralizedMAAStarPlannerForDecPOMDPDiscrete
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)&gmaa_em);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(&params);
  ProblemDecTiger::~ProblemDecTiger(&pdt);
  return;
}

Assistant:

void TestGMAA(const ArgumentHandlers::Arguments& args)
{
    ProblemDecTiger pdt;
//    GeneralizedMAAStarPlanner gmaa(2, &pdt);

    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    GMAA_kGMAA gmaa_em(new BGIP_SolverCreator_AM<JointPolicyPureVector>(), 2, &pdt,&params);

    QMDP qmdp = QMDP(&gmaa_em);
    qmdp.Compute();
    gmaa_em.SetQHeuristic(&qmdp);
    
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Print()---------------------"<<endl;
    gmaa_em.Print();

    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Plan()- QMDP - horizon=2------"<<endl;
    gmaa_em.SetSeed(time(0));
    double V = -DBL_MAX;
    gmaa_em.Plan();
    V = gmaa_em.GetExpectedReward();
    if (!args.testMode)
        cout << "\napprox. value=" << V << endl;
    
    QPOMDP qpomdp = QPOMDP(&gmaa_em);
    qpomdp.Compute();
    gmaa_em.SetQHeuristic(&qpomdp);
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Plan()- QPOMDP - horizon=2----"<<endl;
    gmaa_em.Plan();
    V = gmaa_em.GetExpectedReward();
    if (!args.testMode)
        cout << "\napprox. value="<< V << endl;

    QBG qbg = QBG(&gmaa_em);
    qbg.Compute();
    gmaa_em.SetQHeuristic(&qbg);
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Plan()- QBG - horizon=2----"<<endl;
    gmaa_em.Plan();
    V = gmaa_em.GetExpectedReward();
    if (!args.testMode)
        cout << "\napprox. value="<< V << endl;
    
//    gmaa_em.ClearActionObservationHistories();
//    gmaa_em.ClearJointActionObservationHistories();       

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
    
    GMAA_MAAstarClassic gmaa_maa(2, &pdt,&params);
//    bool calculateJointBeliefs = true;
//    gmaa_maa.CreateActionObservationHistories();
//    gmaa_maa.CreateJointActionObservationHistories(calculateJointBeliefs);    
//    QMDP qmdp = QMDP(gmaa_maa);
    qmdp.SetPU(&gmaa_maa);
    qmdp.Compute();
    gmaa_maa.SetQHeuristic(&qmdp);
    
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_maa.Print()---------------------"<<endl;
    gmaa_maa.Print();

    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_maa.Plan()- QMDP - horizon=2----------------"<<endl;
    gmaa_maa.SetSeed(time(0));
//    double V = -DBL_MAX;
    V = gmaa_maa.GetExpectedReward();
    if (!args.testMode)
        cout << "\nexact. value="<< V << endl;
//    gmaa_maa.ClearActionObservationHistories();
//    gmaa_maa.ClearJointActionObservationHistories();    

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
//    gmaa_maa.SetHorizon(3);
//    gmaa_maa.SetInitialized(true);
    GMAA_MAAstarClassic gmaa_maa3(3, &pdt, &params);
//    gmaa_maa3.CreateActionObservationHistories();
//    gmaa_maa3.CreateJointActionObservationHistories(calculateJointBeliefs);    

    qbg.SetPU(&gmaa_maa3);
    qbg.Compute();
    gmaa_maa3.SetQHeuristic(qbg);    
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_maa3.Print()---------------------"<<endl;
    gmaa_maa3.Print();
    cout << "-gmaa_maa.Plan()- QMDP - horizon=3----------------"<<endl;
    gmaa_maa3.Plan();
    V = gmaa_maa3.GetExpectedReward();
    if (!args.testMode)
        cout << "\nexact. value="<< V << endl;
//    gmaa_maa3.ClearActionObservationHistories();
//    gmaa_maa3.ClearJointActionObservationHistories();    


    
    return;
}